

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

uncertain_measurement units::root(uncertain_measurement *um,int power)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  int iVar4;
  uncertain_measurement uVar5;
  unit local_18;
  
  dVar3 = numericalRoot<double>((double)um->value_,power);
  iVar4 = -power;
  if (0 < power) {
    iVar4 = power;
  }
  uVar1 = um->value_;
  uVar2 = um->uncertainty_;
  local_18 = um->units_;
  uVar5.units_ = root(&local_18,power);
  uVar5.value_ = (float)dVar3;
  uVar5.uncertainty_ =
       (float)((dVar3 * (double)(float)uVar2) / ((double)iVar4 * (double)(float)uVar1));
  return uVar5;
}

Assistant:

uncertain_measurement root(const uncertain_measurement& um, int power)
{
    auto new_value = numericalRoot(um.value(), power);
    auto new_tol = new_value * um.uncertainty() /
        (static_cast<double>((power >= 0) ? power : -power) * um.value());
    return uncertain_measurement(new_value, new_tol, root(um.units(), power));
}